

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O2

int Pdr_InvCheck_int(Gia_Man_t *p,Vec_Int_t *vInv,int fVerbose,sat_solver *pSat,int fSkip)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  Vec_Int_t *p_00;
  int iVar8;
  int Fill;
  sat_solver *psVar9;
  int *piVar10;
  uint uVar11;
  int *piVar12;
  long lVar13;
  
  piVar3 = vInv->pArray;
  p_00 = Vec_IntAlloc(100);
  iVar4 = sat_solver_nvars(pSat);
  iVar1 = p->nRegs;
  iVar2 = p->vCos->nSize;
  piVar12 = piVar3 + 1;
  piVar10 = piVar12;
  for (iVar8 = 0; iVar8 < *piVar3; iVar8 = iVar8 + 1) {
    p_00->nSize = 0;
    for (lVar13 = 0; lVar13 < *piVar10; lVar13 = lVar13 + 1) {
      if (piVar10[lVar13 + 1] != -1) {
        iVar5 = Abc_Lit2Var(piVar10[lVar13 + 1]);
        uVar6 = Abc_LitIsCompl(piVar10[lVar13 + 1]);
        iVar5 = Abc_Var2Lit(iVar5 + (iVar4 - iVar1),uVar6 ^ 1);
        Vec_IntPush(p_00,iVar5);
      }
    }
    if ((long)p_00->nSize == 0) goto LAB_004dba27;
    iVar5 = sat_solver_addclause(pSat,p_00->pArray,p_00->pArray + p_00->nSize);
    if (iVar5 != 1) {
      __assert_fail("status == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                    ,0x2dc,"int Pdr_InvCheck_int(Gia_Man_t *, Vec_Int_t *, int, sat_solver *, int)")
      ;
    }
    piVar10 = piVar10 + (long)*piVar10 + 1;
  }
  iVar4 = 0;
  uVar6 = 0;
  do {
    do {
      uVar11 = uVar6;
      if (p->vCos->nSize - p->nRegs <= (int)uVar11) {
LAB_004dba37:
        iVar8 = 0;
        uVar6 = 0;
        goto LAB_004dba53;
      }
      uVar6 = uVar11 + 1;
      iVar8 = Abc_Var2Lit(uVar6,0);
      Vec_IntFill(p_00,iVar8,Fill);
      psVar9 = pSat;
      iVar8 = sat_solver_solve(pSat,p_00->pArray,p_00->pArray + p_00->nSize,0,0,0,0);
    } while (iVar8 == -1);
    if (iVar8 == 0) goto LAB_004dba37;
    if (iVar8 != 1) {
      __assert_fail("status == l_False",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                    ,0x2f3,"int Pdr_InvCheck_int(Gia_Man_t *, Vec_Int_t *, int, sat_solver *, int)")
      ;
    }
    if (fVerbose != 0) {
      Abc_Print((int)psVar9,"Coverage check failed for output %d.\n",(ulong)uVar11);
    }
    iVar4 = iVar4 + 1;
  } while (fSkip == 0);
LAB_004dba27:
  Vec_IntFree(p_00);
  return 1;
LAB_004dba53:
  if (*piVar3 <= (int)uVar6) {
LAB_004dbb36:
    Vec_IntFree(p_00);
    return iVar8 + iVar4;
  }
  p_00->nSize = 0;
  for (lVar13 = 0; lVar13 < *piVar12; lVar13 = lVar13 + 1) {
    if (piVar12[lVar13 + 1] != -1) {
      iVar5 = Abc_Lit2Var(piVar12[lVar13 + 1]);
      iVar7 = Abc_LitIsCompl(piVar12[lVar13 + 1]);
      iVar5 = Abc_Var2Lit(iVar5 + (iVar2 - iVar1) + 1,iVar7);
      Vec_IntPush(p_00,iVar5);
    }
  }
  psVar9 = pSat;
  iVar5 = sat_solver_solve(pSat,p_00->pArray,p_00->pArray + p_00->nSize,0,0,0,0);
  iVar7 = (int)psVar9;
  if ((fVerbose != 0) && (iVar5 != 1)) {
    Abc_Print(iVar7,"Finished checking clause %d (out of %d)...\r",(ulong)uVar6);
  }
  if (iVar5 != -1) {
    if (iVar5 != 1) {
      if (iVar5 != 0) {
        __assert_fail("status == l_True",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrInv.c"
                      ,0x307,
                      "int Pdr_InvCheck_int(Gia_Man_t *, Vec_Int_t *, int, sat_solver *, int)");
      }
      goto LAB_004dbb36;
    }
    if (fVerbose != 0) {
      Abc_Print(iVar7,"Inductiveness check failed for clause %d.\n",(ulong)uVar6);
    }
    if (fSkip != 0) goto LAB_004dba27;
    iVar8 = iVar8 + 1;
  }
  uVar6 = uVar6 + 1;
  piVar12 = piVar12 + (long)*piVar12 + 1;
  goto LAB_004dba53;
}

Assistant:

int Pdr_InvCheck_int( Gia_Man_t * p, Vec_Int_t * vInv, int fVerbose, sat_solver * pSat, int fSkip )
{
    int nBTLimit = 0;
    int fCheckProperty = 1;
    int i, k, status, nFailed = 0, nFailedOuts = 0; 
    // collect cubes
    int * pCube, * pList = Vec_IntArray(vInv);
    // create variables
    Vec_Int_t * vLits = Vec_IntAlloc(100);
    int iFoVarBeg = sat_solver_nvars(pSat) - Gia_ManRegNum(p);
    int iFiVarBeg = 1 + Gia_ManPoNum(p);
    // add cubes
    Pdr_ForEachCube( pList, pCube, i )
    {
        // collect literals
        Vec_IntClear( vLits );
        for ( k = 0; k < pCube[0]; k++ )
            if ( pCube[k+1] != -1 )
                Vec_IntPush( vLits, Abc_Var2Lit(iFoVarBeg + Abc_Lit2Var(pCube[k+1]), !Abc_LitIsCompl(pCube[k+1])) );
        if ( Vec_IntSize(vLits) == 0 )
        {
            Vec_IntFree( vLits );
            return 1;
        }
        // add it to the solver
        status = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits) );
        assert( status == 1 );
    }
    // verify property output
    if ( fCheckProperty )
    {
        for ( i = 0; i < Gia_ManPoNum(p); i++ )
        {
            Vec_IntFill( vLits, 1, Abc_Var2Lit(1+i, 0) );
            status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
            if ( status == l_Undef ) // timeout
                break;
            if ( status == l_True ) // sat - property fails
            {
                if ( fVerbose )
                    Abc_Print(1, "Coverage check failed for output %d.\n", i );
                nFailedOuts++;
                if ( fSkip )
                {
                    Vec_IntFree( vLits );
                    return 1;
                }
                continue;
            }
            assert( status == l_False ); // unsat - property holds
        }
    }
    // iterate through cubes in the direct order
    Pdr_ForEachCube( pList, pCube, i )
    {
        // collect cube
        Vec_IntClear( vLits );
        for ( k = 0; k < pCube[0]; k++ )
            if ( pCube[k+1] != -1 )
                Vec_IntPush( vLits, Abc_Var2Lit(iFiVarBeg + Abc_Lit2Var(pCube[k+1]), Abc_LitIsCompl(pCube[k+1])) );
        // check if this cube intersects with the complement of other cubes in the solver
        // if it does not intersect, then it is redundant and can be skipped
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
        if ( status != l_True && fVerbose )
            Abc_Print(1, "Finished checking clause %d (out of %d)...\r", i, pList[0] );
        if ( status == l_Undef ) // timeout
            break;
        if ( status == l_False ) // unsat -- correct
            continue;
        assert( status == l_True );
        if ( fVerbose )
            Abc_Print(1, "Inductiveness check failed for clause %d.\n", i );
        nFailed++;
        if ( fSkip )
        {
            Vec_IntFree( vLits );
            return 1;
        }
    }
    Vec_IntFree( vLits );
    return nFailed + nFailedOuts;
}